

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

string * findModelObjectiveName_abi_cxx11_
                   (string *__return_storage_ptr__,HighsLp *lp,HighsHessian *hessian)

{
  double dVar1;
  pointer pcVar2;
  pointer pbVar3;
  long lVar4;
  size_t __n;
  _Alloc_hider _Var5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  string *psVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  string trimmed_name;
  string local_70;
  long local_50;
  char *local_48;
  ulong local_40;
  string *local_38;
  
  iVar6 = std::__cxx11::string::compare((char *)&lp->objective_name_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar6 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__);
    if (0 < (long)lp->num_col_) {
      lVar7 = 0;
      do {
        dVar1 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          bVar11 = true;
          goto LAB_0024dfd8;
        }
        lVar7 = lVar7 + 1;
      } while (lp->num_col_ != lVar7);
    }
    if (hessian == (HighsHessian *)0x0) {
      bVar11 = false;
    }
    else {
      bVar11 = hessian->dim_ != 0;
    }
LAB_0024dfd8:
    local_48 = "NoObj";
    if (bVar11 != false) {
      local_48 = "Obj";
    }
    local_50 = (ulong)(bVar11 ^ 1) * 2 + 3;
    uVar8 = 0;
    local_38 = __return_storage_ptr__;
    do {
      psVar9 = local_38;
      std::__cxx11::string::_M_replace
                ((ulong)local_38,0,(char *)local_38->_M_string_length,(ulong)local_48);
      if ((lp->row_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (lp->row_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        return psVar9;
      }
      if ((int)uVar8 != 0) {
        std::__cxx11::string::push_back((char)psVar9);
      }
      if (lp->num_row_ < 1) {
        return psVar9;
      }
      bVar11 = true;
      lVar10 = 8;
      lVar7 = 0;
      local_40 = uVar8;
      do {
        pbVar3 = (lp->row_names_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        lVar4 = *(long *)((long)pbVar3 + lVar10 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,lVar4,
                   *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10) + lVar4);
        trim(&local_70,&default_non_chars_abi_cxx11_);
        std::__cxx11::string::_M_assign((string *)&local_70);
        _Var5._M_p = local_70._M_dataplus._M_p;
        __n = psVar9->_M_string_length;
        if (__n == local_70._M_string_length) {
          if (__n == 0) {
            bVar11 = false;
            bVar12 = true;
          }
          else {
            iVar6 = bcmp((psVar9->_M_dataplus)._M_p,local_70._M_dataplus._M_p,__n);
            bVar12 = iVar6 == 0;
            bVar11 = (bool)(!bVar12 & bVar11);
          }
        }
        else {
          bVar12 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != &local_70.field_2) {
          operator_delete(_Var5._M_p);
        }
        if (bVar12) break;
        lVar7 = lVar7 + 1;
        lVar10 = lVar10 + 0x20;
        psVar9 = local_38;
      } while (lVar7 < lp->num_row_);
      uVar8 = (ulong)((int)local_40 + 1);
      __return_storage_ptr__ = local_38;
    } while (!bVar11);
  }
  else {
    pcVar2 = (lp->objective_name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (lp->objective_name_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string findModelObjectiveName(const HighsLp* lp,
                                   const HighsHessian* hessian) {
  // Return any non-trivial current objective name
  if (lp->objective_name_ != "") return lp->objective_name_;

  std::string objective_name = "";
  // Determine whether there is a nonzero cost vector
  bool has_objective = false;
  for (HighsInt iCol = 0; iCol < lp->num_col_; iCol++) {
    if (lp->col_cost_[iCol]) {
      has_objective = true;
      break;
    }
  }
  if (!has_objective && hessian) {
    // Zero cost vector, so only chance of an objective comes from any
    // Hessian
    has_objective = (hessian->dim_ != 0);
  }
  HighsInt pass = 0;
  for (;;) {
    // Loop until a valid name is found. Vanishingly unlikely to have
    // to pass more than once, since check for objective name
    // duplicating a row name is very unlikely to fail
    //
    // So set up an appropriate name (stem)
    if (has_objective) {
      objective_name = "Obj";
    } else {
      objective_name = "NoObj";
    }
    // If there are no row names, then the objective name is certainly
    // OK
    if (lp->row_names_.size() == 0) break;
    if (pass != 0) objective_name += pass;
    // Ensure that the objective name doesn't clash with any row names
    bool ok_objective_name = true;
    for (HighsInt iRow = 0; iRow < lp->num_row_; iRow++) {
      std::string trimmed_name = lp->row_names_[iRow];
      trimmed_name = trim(trimmed_name);
      if (objective_name == trimmed_name) {
        ok_objective_name = false;
        break;
      }
    }
    if (ok_objective_name) break;
    pass++;
  }
  assert(objective_name != "");
  return objective_name;
}